

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void continuation(size_t W)

{
  char *pcVar1;
  Node *v;
  code *pcVar2;
  double dVar3;
  FlowBuilder this;
  char extraout_AL;
  TestCaseData *pTVar4;
  long *plVar5;
  Executor *this_00;
  Node *this_01;
  long lVar6;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int w;
  int local_2f4;
  ResultBuilder DOCTEST_RB;
  shared_ptr<tf::WorkerInterface> local_278;
  Result local_260;
  undefined1 *local_240;
  Enum local_238;
  Taskflow taskflow;
  Executor executor;
  
  tf::Taskflow::Taskflow(&taskflow);
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  lVar6 = *(long *)(in_FS_OFFSET + -8);
  w = -1;
  if ((lVar6 != 0) && (*(Executor **)(lVar6 + 0x18) == &executor)) {
    w = *(int *)(lVar6 + 8);
  }
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x3ed;
  DOCTEST_RB.super_AssertData.m_expr = "w == -1";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_2f4 = -1;
  local_240 = (undefined1 *)&w;
  local_238 = DOCTEST_RB.super_AssertData.m_at;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_260,(Expression_lhs<int_const&> *)&local_240,&local_2f4);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_260);
  doctest::String::~String(&local_260.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  this_01 = (Node *)0x0;
  for (lVar6 = 0; this._graph = taskflow.super_FlowBuilder._graph, lVar6 != 1000; lVar6 = lVar6 + 1)
  {
    pTVar4 = (TestCaseData *)operator_new(0xd8);
    (pTVar4->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&(pTVar4->m_file).field_0 + 8) = &pTVar4->m_line;
    *(undefined8 *)((long)&(pTVar4->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&pTVar4->m_line = 0;
    pcVar1 = (char *)((long)&pTVar4[1].m_file.field_0 + 0x10);
    pTVar4->m_test_suite = (char *)0x0;
    pTVar4->m_description = (char *)0x0;
    pTVar4->m_skip = false;
    pTVar4->m_no_breaks = false;
    pTVar4->m_no_output = false;
    pTVar4->m_may_fail = false;
    pTVar4->m_should_fail = false;
    *(undefined3 *)&pTVar4->field_0x3d = 0;
    *(undefined8 *)&pTVar4->m_expected_failures = 0;
    pTVar4->m_timeout = (double)pcVar1;
    pTVar4[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&pTVar4[1].m_file.field_0 + 8) = &pTVar4[1].m_description;
    pTVar4[1].m_description = (char *)0x0;
    pTVar4[1].m_skip = false;
    pTVar4[1].m_no_breaks = false;
    pTVar4[1].m_no_output = false;
    pTVar4[1].m_may_fail = false;
    pTVar4[1].m_should_fail = false;
    *(undefined3 *)&pTVar4[1].field_0x3d = 0;
    *(undefined8 *)&pTVar4[1].m_expected_failures = 0;
    pTVar4[1].m_timeout = 0.0;
    pTVar4[2].m_file.field_0.data.ptr = (char *)0x0;
    plVar5 = (long *)operator_new(0x18);
    *plVar5 = lVar6;
    plVar5[1] = (long)&w;
    plVar5[2] = (long)&executor;
    *(long **)&pTVar4[1].m_skip = plVar5;
    pTVar4[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:1008:29)>
                 ::_M_invoke;
    pTVar4[1].m_timeout =
         (double)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:1008:29)>
                 ::_M_manager;
    *(undefined1 *)&pTVar4[2].m_name = 1;
    pTVar4[2].m_test_suite = (char *)0x0;
    pTVar4[2].m_description = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case = pTVar4;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)this._graph,
               (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB.super_AssertData)
    ;
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB.super_AssertData)
    ;
    v = ((this._graph)->
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ).
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
        super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
        super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    if (lVar6 != 0) {
      tf::Node::_precede(this_01,v);
    }
    this_01 = v;
  }
  this_00 = &executor;
  tf::Executor::run((Future<void> *)&DOCTEST_RB,this_00,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB,this_00);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void continuation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);
  
  tf::Task curr, prev;

  int w = executor.this_worker_id();

  REQUIRE(w == -1);

  for(size_t i=0; i<1000; i++) {
    curr = taskflow.emplace([&, i]() mutable {
      if(i == 0) {
        w = executor.this_worker_id();
      } 
      else {
        REQUIRE(w == executor.this_worker_id());
      }
    });

    if(i) {
      prev.precede(curr);
    }

    prev = curr;
  }

  executor.run(taskflow).wait();

}